

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

void __thiscall
QFontEngine::setGlyphCache(QFontEngine *this,void *context,QFontEngineGlyphCache *cache)

{
  bool bVar1;
  list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_> *__x;
  QFontEngineGlyphCache *pQVar2;
  size_type sVar3;
  QFontEngineGlyphCache *in_RDX;
  long in_FS_OFFSET;
  GlyphCacheEntry *e;
  GlyphCaches *__range1;
  GlyphCaches *caches;
  GlyphCacheEntry entry;
  iterator __end1;
  iterator __begin1;
  QFontEngineGlyphCache *in_stack_ffffffffffffffa8;
  list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>
  *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_> *this_00;
  _Self local_20;
  _Self local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __x = QHash<const_void_*,_std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>_>
        ::operator[]((QHash<const_void_*,_std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>_>
                      *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffb8);
  local_18[0]._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = __x;
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>::begin
                 (in_stack_ffffffffffffffb0);
  local_20._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>::end
                 (in_stack_ffffffffffffffb0);
  while (bVar1 = std::operator!=(local_18,&local_20), bVar1) {
    in_stack_ffffffffffffffb0 =
         (list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_> *)
         std::_List_iterator<QFontEngine::GlyphCacheEntry>::operator*
                   ((_List_iterator<QFontEngine::GlyphCacheEntry> *)0x76125c);
    in_stack_ffffffffffffffa8 = in_RDX;
    pQVar2 = QExplicitlySharedDataPointer<QFontEngineGlyphCache>::data
                       ((QExplicitlySharedDataPointer<QFontEngineGlyphCache> *)0x761274);
    if (in_stack_ffffffffffffffa8 == pQVar2) goto LAB_007612e8;
    std::_List_iterator<QFontEngine::GlyphCacheEntry>::operator++(local_18);
  }
  sVar3 = std::__cxx11::
          list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>::size
                    ((list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>
                      *)0x76129a);
  if (sVar3 == 4) {
    std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>
    ::pop_back(in_stack_ffffffffffffffb0);
  }
  GlyphCacheEntry::GlyphCacheEntry((GlyphCacheEntry *)0x7612c0);
  QExplicitlySharedDataPointer<QFontEngineGlyphCache>::operator=
            ((QExplicitlySharedDataPointer<QFontEngineGlyphCache> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>::
  push_front(this_00,(value_type *)__x);
  GlyphCacheEntry::~GlyphCacheEntry((GlyphCacheEntry *)0x7612e8);
LAB_007612e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontEngine::setGlyphCache(const void *context, QFontEngineGlyphCache *cache)
{
    Q_ASSERT(cache);

    GlyphCaches &caches = m_glyphCaches[context];
    for (auto & e : caches) {
        if (cache == e.cache.data())
            return;
    }

    // Limit the glyph caches to 4 per context. This covers all 90 degree rotations,
    // and limits memory use when there is continuous or random rotation
    if (caches.size() == 4)
        caches.pop_back();

    GlyphCacheEntry entry;
    entry.cache = cache;
    caches.push_front(entry);

}